

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGeneratorTests.cpp
# Opt level: O2

void __thiscall
solitaire::cards::ShuffledDeckGeneratorTest_generateShuffledDeck_Test::TestBody
          (ShuffledDeckGeneratorTest_generateShuffledDeck_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertHelper local_500;
  string local_4f8 [13];
  AssertionResult gtest_ar_;
  Deck generatedDeck;
  
  ShuffledDeckGenerator::generate
            ((Deck *)generatedDeck._M_elems,&(this->super_ShuffledDeckGeneratorTest).generator);
  bVar1 = std::
          is_sorted<solitaire::cards::Card*,bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>
                    (generatedDeck._M_elems,(Card *)&stack0xffffffffffffffe8,
                     anon_unknown_7::cardsComparator);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_4f8,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::is_sorted( generatedDeck.begin(), generatedDeck.end(), cardsComparator )",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
               ,0x1e,local_4f8[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)local_4f8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::
  __sort<solitaire::cards::Card*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>>
            (generatedDeck._M_elems,(Card *)&stack0xffffffffffffffe8,
             (_Iter_comp_iter<bool_(*)(const_solitaire::cards::Card_&,_const_solitaire::cards::Card_&)>
              )0x1959b1);
  createSortedDeck();
  memcpy(local_4f8,&gtest_ar_,0x1a0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>>>
  ::operator()(&gtest_ar,(char *)local_4f8,(array<solitaire::cards::Card,_52UL> *)"generatedDeck");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_4f8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((long *)local_4f8[0]._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4f8[0]._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ShuffledDeckGeneratorTest, generateShuffledDeck) {
    auto generatedDeck = generator.generate();

    EXPECT_FALSE(std::is_sorted(
        generatedDeck.begin(), generatedDeck.end(), cardsComparator
    ));

    std::sort(generatedDeck.begin(), generatedDeck.end(), cardsComparator);
    EXPECT_THAT(generatedDeck, ContainerEq(createSortedDeck()));
}